

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_right_delim_join.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalRightDelimJoin::PhysicalRightDelimJoin
          (PhysicalRightDelimJoin *this,PhysicalPlanGenerator *planner,
          vector<duckdb::LogicalType,_true> *types,PhysicalOperator *original_join,
          PhysicalOperator *distinct,
          vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *delim_scans,
          idx_t estimated_cardinality,optional_idx delim_idx)

{
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_00;
  reference pvVar1;
  PhysicalOperator *pPVar2;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhysicalDelimJoin::PhysicalDelimJoin
            (&this->super_PhysicalDelimJoin,RIGHT_DELIM_JOIN,
             (vector<duckdb::LogicalType,_true> *)&local_38,original_join,distinct,delim_scans,
             estimated_cardinality,delim_idx);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  (this->super_PhysicalDelimJoin).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalDelimJoin_027bb060;
  pvVar1 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                     (&((this->super_PhysicalDelimJoin).join)->children,1);
  this_00 = &(this->super_PhysicalDelimJoin).super_PhysicalOperator.children;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ::push_back(&this_00->
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              ,pvVar1);
  pvVar1 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>(this_00,0);
  pPVar2 = PhysicalPlanGenerator::
           Make<duckdb::PhysicalDummyScan,duckdb::vector<duckdb::LogicalType,true>const&,unsigned_long&>
                     (planner,&pvVar1->_M_data->types,&estimated_cardinality);
  pvVar1 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                     (&((this->super_PhysicalDelimJoin).join)->children,1);
  pvVar1->_M_data = pPVar2;
  return;
}

Assistant:

PhysicalRightDelimJoin::PhysicalRightDelimJoin(PhysicalPlanGenerator &planner, vector<LogicalType> types,
                                               PhysicalOperator &original_join, PhysicalOperator &distinct,
                                               const vector<const_reference<PhysicalOperator>> &delim_scans,
                                               idx_t estimated_cardinality, optional_idx delim_idx)
    : PhysicalDelimJoin(PhysicalOperatorType::RIGHT_DELIM_JOIN, std::move(types), original_join, distinct, delim_scans,
                        estimated_cardinality, delim_idx) {
	D_ASSERT(join.children.size() == 2);
	// now for the original join
	// we take its right child, this is the side that we will duplicate eliminate
	children.push_back(join.children[1]);

	// we replace it with a PhysicalDummyScan, which contains no data, just the types, it won't be scanned anyway
	join.children[1] = planner.Make<PhysicalDummyScan>(children[0].get().GetTypes(), estimated_cardinality);
}